

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O2

string * CLI::detail::remove_quotes(string *str)

{
  char cVar1;
  char *pcVar2;
  __const_iterator __first;
  
  if (1 < str->_M_string_length) {
    pcVar2 = (str->_M_dataplus)._M_p;
    cVar1 = *pcVar2;
    if (((cVar1 == '\'') || (cVar1 == '\"')) && (cVar1 == pcVar2[str->_M_string_length - 1])) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back(str)
      ;
      __first._M_current = (str->_M_dataplus)._M_p;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (str,__first,(__const_iterator)(__first._M_current + 1));
    }
  }
  return str;
}

Assistant:

inline std::string &remove_quotes(std::string &str) {
    if(str.length() > 1 && (str.front() == '"' || str.front() == '\'')) {
        if(str.front() == str.back()) {
            str.pop_back();
            str.erase(str.begin(), str.begin() + 1);
        }
    }
    return str;
}